

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mgm.c
# Opt level: O1

int main(void)

{
  uchar *key;
  uchar *nonce;
  size_t nlen;
  uchar *aad;
  size_t alen;
  uchar *ptext;
  size_t plen;
  uchar *exp_ctext;
  uchar *exp_tag;
  uint uVar1;
  EVP_CIPHER *ciph;
  EVP_CIPHER *pEVar2;
  uint uVar3;
  int small;
  char *pcVar4;
  testcase *ptVar5;
  int local_7c;
  
  OPENSSL_init_crypto(0x4c,0);
  ptVar5 = testcases;
  pcVar4 = "kuznyechik-mgm";
  local_7c = 0;
  uVar3 = 0;
  while( true ) {
    ciph = EVP_get_cipherbyname(pcVar4);
    pEVar2 = (EVP_CIPHER *)EVP_CIPHER_fetch(0,pcVar4,0);
    if (ciph == (EVP_CIPHER *)0x0) {
      ciph = pEVar2;
    }
    if (ciph == (EVP_CIPHER *)0x0) {
      printf("failed to load %s\n",pcVar4);
      local_7c = 1;
    }
    else {
      pcVar4 = (char *)EVP_CIPHER_get0_name(ciph);
      small = 0;
      printf("Tests for %s\n",pcVar4);
      key = ptVar5->key;
      nonce = ptVar5->nonce;
      nlen = ptVar5->nonce_len;
      aad = ptVar5->aad;
      alen = ptVar5->aad_len;
      ptext = ptVar5->plaintext;
      plen = ptVar5->ptext_len;
      exp_ctext = ptVar5->expected;
      exp_tag = ptVar5->expected_tag;
      do {
        uVar1 = test_block((EVP_CIPHER *)ciph,pcVar4,nonce,nlen,aad,alen,ptext,plen,exp_ctext,
                           exp_tag,key,small);
        uVar3 = uVar3 | uVar1;
        small = small + 1;
      } while (small == 1);
      EVP_CIPHER_free(pEVar2);
    }
    if (ciph == (EVP_CIPHER *)0x0) break;
    pcVar4 = ptVar5[1].sn;
    ptVar5 = ptVar5 + 1;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "Some tests FAILED!";
      if (uVar3 == 0) {
        pcVar4 = "All tests passed!";
      }
      puts(pcVar4);
      return uVar3;
    }
  }
  return local_7c;
}

Assistant:

int main(void)
{
    int ret = 0;
    const struct testcase *t;

    OPENSSL_add_all_algorithms_conf();

    for (t = testcases; t->sn; t++) {
        int small;
        const EVP_CIPHER *ciph_eng = EVP_get_cipherbyname(t->sn);
        EVP_CIPHER *ciph_prov = EVP_CIPHER_fetch(NULL, t->sn, NULL);
        const EVP_CIPHER *ciph = ciph_eng ? ciph_eng : ciph_prov;
        const char *name;
        if (!ciph) {
            printf("failed to load %s\n", t->sn);
            return 1;
        }
        name = EVP_CIPHER_name(ciph);

        printf("Tests for %s\n", name);
        for (small = 0; small <= 1; small++)
            ret |= test_block(ciph, name, t->nonce, t->nonce_len,
                              t->aad, t->aad_len, t->plaintext, t->ptext_len,
                              t->expected, t->expected_tag, t->key, small);
        EVP_CIPHER_free(ciph_prov);
    }

    if (ret) {
        printf("Some tests FAILED!\n");
    } else {
        printf("All tests passed!\n");
    }
    return ret;
}